

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O0

this_t * __thiscall aeron::Context::conclude(Context *this)

{
  this_t *in_RDI;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  *in_stack_00000008;
  
  if (in_RDI->m_mediaDriverTimeout == -1) {
    in_RDI->m_mediaDriverTimeout = 10000;
  }
  if (in_RDI->m_resourceLingerTimeout == -1) {
    in_RDI->m_resourceLingerTimeout = 5000;
  }
  if ((in_RDI->m_isOnNewExclusivePublicationHandlerSet & 1U) == 0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
    ::operator=((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
                 *)this,in_stack_00000008);
  }
  return in_RDI;
}

Assistant:

this_t& conclude()
    {
        if (NULL_TIMEOUT == m_mediaDriverTimeout)
        {
            m_mediaDriverTimeout = DEFAULT_MEDIA_DRIVER_TIMEOUT_MS;
        }

        if (NULL_TIMEOUT == m_resourceLingerTimeout)
        {
            m_resourceLingerTimeout = DEFAULT_RESOURCE_LINGER_MS;
        }

        if (!m_isOnNewExclusivePublicationHandlerSet)
        {
            m_onNewExclusivePublicationHandler = m_onNewPublicationHandler;
        }

        return *this;
    }